

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

void __thiscall
re2::TestInstance::TestInstance
          (TestInstance *this,StringPiece *regexp_str,MatchKind kind,ParseFlags flags)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  Regexp *this_00;
  Prog *pPVar4;
  ostream *poVar5;
  RE2 *this_01;
  PCRE *this_02;
  MatchKind kind_00;
  ParseFlags flags_00;
  ParseFlags flags_01;
  StringPiece *src;
  StringPiece *src_00;
  StringPiece *src_01;
  StringPiece *src_02;
  StringPiece *src_03;
  StringPiece *src_04;
  string re;
  string local_228;
  undefined1 local_208 [5];
  bool bStack_203;
  bool bStack_202;
  undefined1 uStack_201;
  int iStack_200;
  undefined4 uStack_1fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  LogMessage local_1c8;
  RegexpStatus status;
  
  this->regexp_str_ = regexp_str;
  this->kind_ = kind;
  this->flags_ = flags;
  this->error_ = false;
  this->regexp_ = (Regexp *)0x0;
  this->num_captures_ = 0;
  this->prog_ = (Prog *)0x0;
  this->rprog_ = (Prog *)0x0;
  this->re_ = (PCRE *)0x0;
  this->re2_ = (RE2 *)0x0;
  status.code_ = kRegexpSuccess;
  status.error_arg_.ptr_ = (char *)0x0;
  status.error_arg_.length_ = 0;
  status.tmp_ = (string *)0x0;
  this_00 = Regexp::Parse(regexp_str,flags,&status);
  this->regexp_ = this_00;
  if (this_00 == (Regexp *)0x0) {
    LogMessage::LogMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0xb6,0);
    poVar5 = std::operator<<((ostream *)((long)&local_1c8 + 8),"Cannot parse: ");
    CEscape_abi_cxx11_(&re,(re2 *)this->regexp_str_,src_01);
    poVar5 = std::operator<<(poVar5,(string *)&re);
    poVar5 = std::operator<<(poVar5," mode: ");
    FormatMode_abi_cxx11_(&local_228,(re2 *)(ulong)flags,flags_01);
    std::operator<<(poVar5,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
  }
  else {
    iVar2 = Regexp::NumCaptures(this_00);
    this->num_captures_ = iVar2;
    pPVar4 = Regexp::CompileToProg(this->regexp_,0);
    this->prog_ = pPVar4;
    if (pPVar4 != (Prog *)0x0) {
      if (FLAGS_dump_prog == '\x01') {
        LogMessage::LogMessage
                  (&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0xc3,0);
        poVar5 = std::operator<<((ostream *)((long)&local_1c8 + 8),"Prog for ");
        poVar5 = std::operator<<(poVar5," regexp ");
        CEscape_abi_cxx11_(&re,(re2 *)this->regexp_str_,src);
        poVar5 = std::operator<<(poVar5,(string *)&re);
        poVar5 = std::operator<<(poVar5," (");
        FormatKind_abi_cxx11_(&local_228,(re2 *)(ulong)this->kind_,kind_00);
        poVar5 = std::operator<<(poVar5,(string *)&local_228);
        poVar5 = std::operator<<(poVar5,", ");
        FormatMode_abi_cxx11_((string *)local_208,(re2 *)(ulong)this->flags_,flags_00);
        poVar5 = std::operator<<(poVar5,(string *)local_208);
        poVar5 = std::operator<<(poVar5,")\n");
        Prog::Dump_abi_cxx11_(&local_1e8,this->prog_);
        std::operator<<(poVar5,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&re);
        LogMessage::~LogMessage(&local_1c8);
      }
      uVar3 = Engines();
      if ((uVar3 & 0xc) != 0) {
        pPVar4 = Regexp::CompileToReverseProg(this->regexp_,0);
        this->rprog_ = pPVar4;
        if (pPVar4 == (Prog *)0x0) {
          LogMessage::LogMessage
                    (&local_1c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                     ,0xd0,0);
          poVar5 = std::operator<<((ostream *)((long)&local_1c8 + 8),"Cannot reverse compile: ");
          CEscape_abi_cxx11_(&re,(re2 *)this->regexp_str_,src_04);
          std::operator<<(poVar5,(string *)&re);
          goto LAB_0012391e;
        }
        if (FLAGS_dump_rprog == '\x01') {
          LogMessage::LogMessage
                    (&local_1c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                     ,0xd5,0);
          Prog::Dump_abi_cxx11_(&re,this->rprog_);
          std::operator<<((ostream *)((long)&local_1c8 + 8),(string *)&re);
          std::__cxx11::string::~string((string *)&re);
          LogMessage::~LogMessage(&local_1c8);
        }
      }
      StringPiece::as_string_abi_cxx11_(&re,regexp_str);
      if ((flags & OneLine) == NoParseFlags) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8,"(?m)",&re);
        std::__cxx11::string::operator=((string *)&re,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      if ((flags & NonGreedy) != NoParseFlags) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8,"(?U)",&re);
        std::__cxx11::string::operator=((string *)&re,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      if ((flags & DotNL) != NoParseFlags) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c8,"(?s)",&re);
        std::__cxx11::string::operator=((string *)&re,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      uVar3 = Engines();
      if ((uVar3 & 0x1c0) == 0) {
LAB_001237b4:
        uVar3 = Engines();
        if (((uVar3 >> 9 & 1) != 0) &&
           (bVar1 = Regexp::MimicsPCRE(this->regexp_), bVar1 && this->kind_ != kLongestMatch)) {
          local_208[4] = false;
          bStack_203 = false;
          bStack_202 = false;
          uStack_201 = 0;
          iStack_200 = 0;
          uStack_1fc._0_1_ = true;
          local_208._0_4_ = (~flags & 0x20) << 6;
          this_02 = (PCRE *)operator_new(0x50);
          std::operator+(&local_228,"(",&re);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1c8,&local_228,")");
          PCRE::PCRE(this_02,(string *)&local_1c8,(PCRE_Options *)local_208);
          this->re_ = this_02;
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_228);
          if (this->re_->error_->_M_string_length != 0) {
            LogMessage::LogMessage
                      (&local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                       ,0x106,0);
            poVar5 = std::operator<<((ostream *)((long)&local_1c8 + 8),"Cannot PCRE: ");
            local_1e8._M_dataplus._M_p = re._M_dataplus._M_p;
            local_1e8._M_string_length._0_4_ = (int)re._M_string_length;
            CEscape_abi_cxx11_(&local_228,(re2 *)&local_1e8,src_03);
            std::operator<<(poVar5,(string *)&local_228);
            goto LAB_001236c5;
          }
        }
      }
      else {
        local_208._0_4_ = 1;
        local_208[4] = false;
        bStack_202 = true;
        iStack_200 = 0x800000;
        uStack_1fc._0_1_ = false;
        uStack_1fc._1_3_ = 0;
        local_1f8._M_allocated_capacity = 0x100000000;
        if ((flags & Latin1) != NoParseFlags) {
          local_208._0_4_ = 2;
        }
        bStack_203 = this->kind_ == kLongestMatch;
        this_01 = (RE2 *)operator_new(0xe0);
        local_1c8._0_8_ = re._M_dataplus._M_p;
        local_1c8._8_4_ = (int)re._M_string_length;
        RE2::RE2(this_01,(StringPiece *)&local_1c8,(Options *)local_208);
        this->re2_ = this_01;
        if (this_01->error_->_M_string_length == 0) goto LAB_001237b4;
        LogMessage::LogMessage
                  (&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0xec,0);
        poVar5 = std::operator<<((ostream *)((long)&local_1c8 + 8),"Cannot RE2: ");
        local_1e8._M_dataplus._M_p = re._M_dataplus._M_p;
        local_1e8._M_string_length._0_4_ = (int)re._M_string_length;
        CEscape_abi_cxx11_(&local_228,(re2 *)&local_1e8,src_00);
        std::operator<<(poVar5,(string *)&local_228);
LAB_001236c5:
        std::__cxx11::string::~string((string *)&local_228);
        LogMessage::~LogMessage(&local_1c8);
        this->error_ = true;
      }
      std::__cxx11::string::~string((string *)&re);
      goto LAB_00123937;
    }
    LogMessage::LogMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0xbe,0);
    poVar5 = std::operator<<((ostream *)((long)&local_1c8 + 8),"Cannot compile: ");
    CEscape_abi_cxx11_(&re,(re2 *)this->regexp_str_,src_02);
    std::operator<<(poVar5,(string *)&re);
  }
LAB_0012391e:
  std::__cxx11::string::~string((string *)&re);
  LogMessage::~LogMessage(&local_1c8);
  this->error_ = true;
LAB_00123937:
  RegexpStatus::~RegexpStatus(&status);
  return;
}

Assistant:

TestInstance::TestInstance(const StringPiece& regexp_str, Prog::MatchKind kind,
                           Regexp::ParseFlags flags)
  : regexp_str_(regexp_str),
    kind_(kind),
    flags_(flags),
    error_(false),
    regexp_(NULL),
    num_captures_(0),
    prog_(NULL),
    rprog_(NULL),
    re_(NULL),
    re2_(NULL) {

  VLOG(1) << CEscape(regexp_str);

  // Compile regexp to prog.
  // Always required - needed for backtracking (reference implementation).
  RegexpStatus status;
  regexp_ = Regexp::Parse(regexp_str, flags, &status);
  if (regexp_ == NULL) {
    LOG(INFO) << "Cannot parse: " << CEscape(regexp_str_)
              << " mode: " << FormatMode(flags);
    error_ = true;
    return;
  }
  num_captures_ = regexp_->NumCaptures();
  prog_ = regexp_->CompileToProg(0);
  if (prog_ == NULL) {
    LOG(INFO) << "Cannot compile: " << CEscape(regexp_str_);
    error_ = true;
    return;
  }
  if (FLAGS_dump_prog) {
    LOG(INFO) << "Prog for "
              << " regexp "
              << CEscape(regexp_str_)
              << " (" << FormatKind(kind_)
              << ", " << FormatMode(flags_)
              << ")\n"
              << prog_->Dump();
  }

  // Compile regexp to reversed prog.  Only needed for DFA engines.
  if (Engines() & ((1<<kEngineDFA)|(1<<kEngineDFA1))) {
    rprog_ = regexp_->CompileToReverseProg(0);
    if (rprog_ == NULL) {
      LOG(INFO) << "Cannot reverse compile: " << CEscape(regexp_str_);
      error_ = true;
      return;
    }
    if (FLAGS_dump_rprog)
      LOG(INFO) << rprog_->Dump();
  }

  // Create re string that will be used for RE and RE2.
  string re = regexp_str.as_string();
  // Accomodate flags.
  // Regexp::Latin1 will be accomodated below.
  if (!(flags & Regexp::OneLine))
    re = "(?m)" + re;
  if (flags & Regexp::NonGreedy)
    re = "(?U)" + re;
  if (flags & Regexp::DotNL)
    re = "(?s)" + re;

  // Compile regexp to RE2.
  if (Engines() & ((1<<kEngineRE2)|(1<<kEngineRE2a)|(1<<kEngineRE2b))) {
    RE2::Options options;
    if (flags & Regexp::Latin1)
      options.set_encoding(RE2::Options::EncodingLatin1);
    if (kind_ == Prog::kLongestMatch)
      options.set_longest_match(true);
    re2_ = new RE2(re, options);
    if (!re2_->error().empty()) {
      LOG(INFO) << "Cannot RE2: " << CEscape(re);
      error_ = true;
      return;
    }
  }

  // Compile regexp to RE.
  // PCRE as exposed by the RE interface isn't always usable.
  // 1. It disagrees about handling of empty-string reptitions
  //    like matching (a*)* against "b".  PCRE treats the (a*) as
  //    occurring once, while we treat it as occurring not at all.
  // 2. It treats $ as this weird thing meaning end of string
  //    or before the \n at the end of the string.
  // 3. It doesn't implement POSIX leftmost-longest matching.
  // 4. It lets \s match vertical tab.
  // MimicsPCRE() detects 1 and 2.
  if ((Engines() & (1<<kEnginePCRE)) && regexp_->MimicsPCRE() &&
      kind_ != Prog::kLongestMatch) {
    PCRE_Options o;
    o.set_option(PCRE::UTF8);
    if (flags & Regexp::Latin1)
      o.set_option(PCRE::None);
    // PCRE has interface bug keeping us from finding $0, so
    // add one more layer of parens.
    re_ = new PCRE("("+re+")", o);
    if (!re_->error().empty()) {
      LOG(INFO) << "Cannot PCRE: " << CEscape(re);
      error_ = true;
      return;
    }
  }
}